

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Matchers::MatcherGenericBase::~MatcherGenericBase(MatcherGenericBase *this)

{
  code *pcVar1;
  MatcherGenericBase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

MatcherGenericBase::~MatcherGenericBase() = default;